

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O3

void nlssummary(nls_object obj)

{
  int iVar1;
  long lVar2;
  
  puts("\n");
  printf("Return Value : %d \n",(ulong)(uint)obj->retval);
  iVar1 = obj->retval;
  if (iVar1 == 0) {
    puts("Termination Message : improper input parameters. ");
    iVar1 = obj->retval;
  }
  if (iVar1 == 1) {
    puts(
        "Termination Message : both actual and predicted relative reductions in the sum of squares are at most ftol. "
        );
    iVar1 = obj->retval;
  }
  if (iVar1 == 2) {
    puts("Termination Message : relative error between two consecutive iterates is at most xtol. ");
    iVar1 = obj->retval;
  }
  if (iVar1 == 3) {
    puts("Termination Message : conditions for info = 1 and info = 2 both hold. ");
    iVar1 = obj->retval;
  }
  if (iVar1 == 4) {
    puts(
        "Termination Message : the cosine of the angle between fvec and any column of the jacobian is at most gtol in absolute value. "
        );
    iVar1 = obj->retval;
  }
  if (iVar1 == 5) {
    puts("Termination Message : number of calls to fcn has reached or exceeded maxfev. ");
    iVar1 = obj->retval;
  }
  if (iVar1 == 6) {
    puts(
        "Termination Message : ftol is too small. no further reduction in the sum of squares is possible. "
        );
    iVar1 = obj->retval;
  }
  if (iVar1 == 7) {
    puts(
        "Termination Message : xtol is too small. no further improvement inthe approximate solution x is possible. "
        );
    iVar1 = obj->retval;
  }
  if (iVar1 == 8) {
    puts(
        "Termination Message : gtol is too small. fvec is orthogonal to thecolumns of the jacobian to machine precision. "
        );
  }
  printf("Iterations : %d \n",(ulong)(uint)obj->Iter);
  printf("Function Minimized At : [ ");
  if (0 < obj->N) {
    lVar2 = 0;
    do {
      printf("%g ",obj->xopt[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < obj->N);
  }
  puts(" ] ");
  return;
}

Assistant:

void nlssummary(nls_object obj) {
	int i;
	printf("\n\n");
	printf("Return Value : %d \n",obj->retval);
	if (obj->retval == 0) {
		printf("Termination Message : improper input parameters. \n");
	}
	if (obj->retval == 1) {
		printf("Termination Message : both actual and predicted relative reductions "
				"in the sum of squares are at most ftol. \n");
	}
	if (obj->retval == 2) {
		printf("Termination Message : relative error between two consecutive iterates "
				"is at most xtol. \n");
	}
	if (obj->retval == 3) {
		printf("Termination Message : conditions for info = 1 and info = 2 both hold. \n");
	}
	if (obj->retval == 4) {
		printf("Termination Message : the cosine of the angle between fvec and any "
				"column of the jacobian is at most gtol in absolute value. \n");
	}
	if (obj->retval == 5) {
		printf("Termination Message : number of calls to fcn has reached or "
				"exceeded maxfev. \n");
	}
	if (obj->retval == 6) {
		printf("Termination Message : ftol is too small. no further reduction in "
				"the sum of squares is possible. \n");
	}
	if (obj->retval == 7) {
		printf("Termination Message : xtol is too small. no further improvement in"
				"the approximate solution x is possible. \n");
	}
	if (obj->retval == 8) {
		printf("Termination Message : gtol is too small. fvec is orthogonal to the"
				"columns of the jacobian to machine precision. \n");
	}
	printf("Iterations : %d \n",obj->Iter);
	printf("Function Minimized At : [ ");
	for(i = 0; i < obj->N;++i) {
		printf("%g ",obj->xopt[i]);
	}
	printf(" ] \n");
	//printf("Function Value : %g \n \n",obj->objfunc);

}